

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O1

string * __thiscall
m2d::savanna::get_endpoint::build_path_abi_cxx11_(string *__return_storage_ptr__,get_endpoint *this)

{
  _Rb_tree_header *p_Var1;
  char local_58;
  undefined7 uStack_57;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*(this->super_endpoint)._vptr_endpoint[4])(&local_58);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,CONCAT71(uStack_57,local_58));
  p_Var1 = &local_50._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)CONCAT71(uStack_57,local_58) != p_Var1) {
    operator_delete((undefined1 *)CONCAT71(uStack_57,local_58));
  }
  (*(this->super_endpoint)._vptr_endpoint[3])(&local_58,this);
  if (local_58 == '\x01') {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*(this->super_endpoint)._vptr_endpoint[7])(&local_58,this);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,CONCAT71(uStack_57,local_58));
    if ((_Rb_tree_header *)CONCAT71(uStack_57,local_58) != p_Var1) {
      operator_delete((undefined1 *)CONCAT71(uStack_57,local_58));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string build_path()
		{
			std::string new_path;
			new_path += path();
			if (params()) {
				new_path += "?";
				new_path += param_str();
			}
			return new_path;
		}